

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptoperator.cpp
# Opt level: O0

void __thiscall
ScriptOperator_IsValid_Test::~ScriptOperator_IsValid_Test(ScriptOperator_IsValid_Test *this)

{
  ScriptOperator_IsValid_Test *this_local;
  
  ~ScriptOperator_IsValid_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(ScriptOperator, IsValid) {
  EXPECT_TRUE(ScriptOperator::IsValid("OP_MIN"));
  EXPECT_TRUE(ScriptOperator::IsValid("OP_3"));
  EXPECT_TRUE(ScriptOperator::IsValid("OP_0"));
  EXPECT_TRUE(ScriptOperator::IsValid("OP_1"));
  EXPECT_TRUE(ScriptOperator::IsValid("OP_16"));
  EXPECT_TRUE(ScriptOperator::IsValid("OP_TRUE"));
  EXPECT_TRUE(ScriptOperator::IsValid("OP_FALSE"));
  EXPECT_TRUE(ScriptOperator::IsValid("OP_1NEGATE"));
  EXPECT_FALSE(ScriptOperator::IsValid("OP_xxxx"));
}